

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::add<int,cmdline::default_reader<int>>
          (undefined8 param_1,undefined8 param_2,char param_3,undefined8 param_4,byte param_5,
          undefined4 param_6)

{
  size_type sVar1;
  cmdline_error *this;
  option_with_value_with_reader<int,_cmdline::default_reader<int>_> *__x;
  mapped_type *ppoVar2;
  string *in_stack_ffffffffffffff88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  *in_stack_ffffffffffffff90;
  key_type *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (sVar1 != 0) {
    this = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    cmdline_error::cmdline_error(this,in_stack_ffffffffffffff88);
    __cxa_throw(this,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  __x = (option_with_value_with_reader<int,_cmdline::default_reader<int>_> *)operator_new(0x60);
  option_with_value_with_reader<int,_cmdline::default_reader<int>_>::option_with_value_with_reader
            (__x,param_2,(int)param_3,param_5 & 1,param_6,param_4);
  ppoVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                          *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *ppoVar2 = (mapped_type)__x;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>::
  push_back((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
             *)in_stack_ffffffffffffff90,(value_type *)__x);
  return;
}

Assistant:

void add(const std::string& name, char short_name = 0, const std::string& desc = "", bool need = true,
             const T def = T(), F reader = F()) {
        if (options.count(name)) throw cmdline_error("multiple definition: " + name);
        options[name] = new option_with_value_with_reader<T, F>(name, short_name, need, def, desc, reader);
        ordered.push_back(options[name]);
    }